

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O1

void chrono::utils::WriteVisualizationAssets
               (ChSystem *system,string *filename,function<bool_(const_chrono::ChBody_&)> *selector,
               bool body_info,string *delim)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  pointer psVar4;
  ChBody *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  ChFrameMoving<double> *pCVar8;
  long lVar9;
  pointer psVar10;
  _func_int *p_Var11;
  char cVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar22;
  undefined4 extraout_var_01;
  long lVar23;
  ostream *poVar24;
  ChPhysicsItem *this;
  undefined8 uVar25;
  undefined7 in_register_00000009;
  pointer psVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_> *shape_instance;
  _func_int *p_Var30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R13;
  int iVar31;
  pointer psVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var34;
  CSV_writer csv;
  ChFrame<double> X_GS;
  stringstream header;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_470;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_448;
  int local_43c;
  undefined1 local_438 [16];
  double local_428 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_410;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_408;
  ChSystem *local_400;
  CSV_writer local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  ostream *local_258;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_240;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_208;
  double local_1f0;
  double local_1d8;
  long local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [128];
  double local_138;
  
  local_400 = system;
  local_1c0 = filename;
  CSV_writer::CSV_writer(&local_3f8,delim);
  iVar21 = 0;
  local_43c = 0;
  if ((int)CONCAT71(in_register_00000009,body_info) != 0) {
    psVar32 = (local_400->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (local_400->assembly).bodylist.
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_43c = 0;
    if (psVar32 != psVar4) {
      local_43c = 0;
      do {
        pCVar5 = (psVar32->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var29 = (psVar32->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          }
        }
        if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0094b898;
        bVar19 = (*selector->_M_invoker)((_Any_data *)selector,pCVar5);
        if (bVar19) {
          iVar20 = (*(pCVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar5);
          unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar20);
          iVar20 = (*(pCVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar5);
          lVar23 = CONCAT44(extraout_var_00,iVar20);
          poVar22 = (ostream *)
                    std::ostream::operator<<
                              (&local_3f8.m_ss,
                               (pCVar5->super_ChPhysicsItem).super_ChObj.m_identifier);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          (*(pCVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])(pCVar5);
          bVar19 = SUB81(&local_3f8.m_ss,0);
          poVar22 = std::ostream::_M_insert<bool>(bVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)&unaff_R13->_M_use_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>((double)unaff_R13[1]._vptr__Sp_counted_base);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)&unaff_R13[1]._M_use_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x20));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x28));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + bVar19);
          std::ostream::put(bVar19);
          std::ostream::flush();
          local_43c = local_43c + 1;
        }
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
        }
        psVar32 = psVar32 + 1;
      } while (psVar32 != psVar4);
    }
  }
  p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (local_400->assembly).bodylist.
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_488 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (local_400->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var29 != local_488) {
    poVar1 = &local_3f8.m_ss;
    iVar21 = 0;
    do {
      p_Var28 = p_Var29;
      pCVar5 = ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var28->_vptr__Sp_counted_base)->_M_ptr;
      p_Var29 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var28->_M_use_count)->_M_pi;
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
        }
      }
      if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        local_490 = p_Var29;
LAB_0094b898:
        uVar25 = std::__throw_bad_function_call();
        if (unaff_R13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R13);
        }
        if (local_488 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488);
        }
        if (selector != (function<bool_(const_chrono::ChBody_&)> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)selector);
        }
        if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468);
        }
        if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
        }
        if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
        }
        if (local_4a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8);
        }
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
        }
        if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460);
        }
        CSV_writer::~CSV_writer(&local_3f8);
        _Unwind_Resume(uVar25);
      }
      bVar19 = (*selector->_M_invoker)((_Any_data *)selector,pCVar5);
      if (bVar19) {
        ChPhysicsItem::GetVisualModel(&pCVar5->super_ChPhysicsItem);
        uVar25 = local_1b8._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if ((_func_int **)uVar25 != (_func_int **)0x0) {
          ChPhysicsItem::GetVisualModel(&pCVar5->super_ChPhysicsItem);
          uVar25 = local_1b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          local_478 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar25 + 8);
          for (p_Var33 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)uVar25;
              p_Var33 != local_478;
              p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var33[9]._M_use_count) {
            iVar20 = (*(pCVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar5);
            chrono::operator*((ChFrame<double> *)local_250,
                              (ChFrameMoving<double> *)CONCAT44(extraout_var_01,iVar20),
                              (ChFrame<double> *)(p_Var33 + 1));
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
              lVar23 = 0;
            }
            else {
              lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,&ChVisualShape::typeinfo,
                                      &ChSphereShape::typeinfo);
            }
            if (lVar23 == 0) {
              p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              lVar23 = 0;
            }
            else {
              p_Var27 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var33->_M_use_count;
              if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
                }
              }
            }
            if (lVar23 == 0) {
              if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                lVar23 = 0;
              }
              else {
                lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,&ChVisualShape::typeinfo,
                                        &ChEllipsoidShape::typeinfo);
              }
              if (lVar23 == 0) {
                p_Var34 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                lVar23 = 0;
              }
              else {
                p_Var34 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var33->_M_use_count;
                if (p_Var34 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var34->_M_use_count = p_Var34->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var34->_M_use_count = p_Var34->_M_use_count + 1;
                  }
                }
              }
              if (lVar23 == 0) {
                if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                  lVar23 = 0;
                }
                else {
                  lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,&ChVisualShape::typeinfo,
                                          &ChBoxShape::typeinfo);
                }
                if (lVar23 == 0) {
                  local_470 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  lVar23 = 0;
                }
                else {
                  local_470 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                               &p_Var33->_M_use_count;
                  if (local_470 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_470->_M_use_count = local_470->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_470->_M_use_count = local_470->_M_use_count + 1;
                    }
                  }
                }
                if (lVar23 == 0) {
                  if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                    lVar23 = 0;
                  }
                  else {
                    lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,&ChVisualShape::typeinfo
                                            ,&ChCapsuleShape::typeinfo);
                  }
                  if (lVar23 == 0) {
                    local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    lVar23 = 0;
                  }
                  else {
                    local_4a8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                 &p_Var33->_M_use_count;
                    if (local_4a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        local_4a8->_M_use_count = local_4a8->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        local_4a8->_M_use_count = local_4a8->_M_use_count + 1;
                      }
                    }
                  }
                  if (lVar23 == 0) {
                    if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                      lVar23 = 0;
                    }
                    else {
                      lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                              &ChVisualShape::typeinfo,&ChCylinderShape::typeinfo);
                    }
                    if (lVar23 == 0) {
                      local_4a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      lVar23 = 0;
                    }
                    else {
                      local_4a0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                   &p_Var33->_M_use_count;
                      if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
                        }
                      }
                    }
                    if (lVar23 == 0) {
                      if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                        lVar23 = 0;
                      }
                      else {
                        lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                                &ChVisualShape::typeinfo,&ChConeShape::typeinfo);
                      }
                      if (lVar23 == 0) {
                        local_410 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        lVar23 = 0;
                      }
                      else {
                        local_410 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                     &p_Var33->_M_use_count;
                        if (local_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_410->_M_use_count = local_410->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_410->_M_use_count = local_410->_M_use_count + 1;
                          }
                        }
                      }
                      if (lVar23 == 0) {
                        if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                          lVar23 = 0;
                        }
                        else {
                          lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                                  &ChVisualShape::typeinfo,
                                                  &ChRoundedBoxShape::typeinfo);
                        }
                        if (lVar23 == 0) {
                          local_460 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          lVar23 = 0;
                        }
                        else {
                          local_460 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                       &p_Var33->_M_use_count;
                          if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              local_460->_M_use_count = local_460->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              local_460->_M_use_count = local_460->_M_use_count + 1;
                            }
                          }
                        }
                        if (lVar23 == 0) {
                          if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                            lVar23 = 0;
                          }
                          else {
                            lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                                    &ChVisualShape::typeinfo,
                                                    &ChRoundedCylinderShape::typeinfo);
                          }
                          if (lVar23 == 0) {
                            local_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            lVar23 = 0;
                          }
                          else {
                            local_450 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                         &p_Var33->_M_use_count;
                            if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                local_450->_M_use_count = local_450->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                local_450->_M_use_count = local_450->_M_use_count + 1;
                              }
                            }
                          }
                          if (lVar23 == 0) {
                            if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                              lVar23 = 0;
                            }
                            else {
                              lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                                      &ChVisualShape::typeinfo,
                                                      &ChTriangleMeshShape::typeinfo);
                            }
                            if (lVar23 == 0) {
                              local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              lVar23 = 0;
                            }
                            else {
                              local_458 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           &p_Var33->_M_use_count;
                              if (local_458 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_458->_M_use_count = local_458->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_458->_M_use_count = local_458->_M_use_count + 1;
                                }
                              }
                            }
                            if (lVar23 == 0) {
                              if (p_Var33->_vptr__Sp_counted_base == (_func_int **)0x0) {
                                lVar23 = 0;
                              }
                              else {
                                lVar23 = __dynamic_cast(p_Var33->_vptr__Sp_counted_base,
                                                        &ChVisualShape::typeinfo,
                                                        &ChLineShape::typeinfo,0);
                              }
                              if (lVar23 == 0) {
                                this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                lVar23 = 0;
                              }
                              else {
                                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           &p_Var33->_M_use_count;
                                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    this_00->_M_use_count = this_00->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    this_00->_M_use_count = this_00->_M_use_count + 1;
                                  }
                                }
                              }
                              if (lVar23 == 0) {
                                unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              }
                              else {
                                lVar9 = *(long *)(lVar23 + 0x28);
                                p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                          (lVar23 + 0x30);
                                if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                                  }
                                }
                                local_408 = this_00;
                                local_1c8 = lVar23;
                                if (lVar9 == 0) {
                                  lVar23 = 0;
                                }
                                else {
                                  lVar23 = __dynamic_cast(lVar9,&geometry::ChLine::typeinfo,
                                                          &geometry::ChLineBezier::typeinfo,0);
                                }
                                local_448 = p_Var6;
                                if (lVar23 == 0) {
                                  local_448 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                }
                                if (lVar23 != 0 &&
                                    p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                                    UNLOCK();
                                    local_448 = p_Var6;
                                  }
                                  else {
                                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                                    local_448 = p_Var6;
                                  }
                                }
                                unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            CONCAT71((int7)((ulong)p_Var6 >> 8),lVar23 != 0);
                                local_260 = p_Var6;
                                if (lVar23 != 0) {
                                  poVar22 = (ostream *)
                                            std::ostream::operator<<(local_1b8 + 0x10,0xc);
                                  local_258 = std::__ostream_insert<char,std::char_traits<char>>
                                                        (poVar22,(delim->_M_dataplus)._M_p,
                                                         delim->_M_string_length);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (local_258,"\"",1);
                                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (local_258,*(char **)(local_1c8 + 0x38),
                                                       *(long *)(local_1c8 + 0x40));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\"",1)
                                  ;
                                  iVar21 = iVar21 + 1;
                                }
                                if (local_448 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                   ) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_448);
                                }
                                this_00 = local_408;
                                if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                   ) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_260);
                                  this_00 = local_408;
                                }
                              }
                              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (this_00);
                              }
                            }
                            else {
                              poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,5);
                              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar22,(delim->_M_dataplus)._M_p,
                                                   delim->_M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\"",1);
                              poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar22,*(char **)(lVar23 + 0x40),
                                                   *(long *)(lVar23 + 0x48));
                              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"\"",1);
                              iVar21 = iVar21 + 1;
                              unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          CONCAT71((int7)((ulong)poVar22 >> 8),1);
                            }
                            if (local_458 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_458);
                            }
                          }
                          else {
                            poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,10);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                            poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                            poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                            std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x40));
                            iVar21 = iVar21 + 1;
                            unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        CONCAT71((int7)((ulong)lVar23 >> 8),1);
                          }
                          if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450)
                            ;
                          }
                        }
                        else {
                          poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                          poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x40));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                          std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x48));
                          iVar21 = iVar21 + 1;
                          unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      CONCAT71((int7)((ulong)lVar23 >> 8),1);
                        }
                        if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460);
                        }
                      }
                      else {
                        poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                        poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x48));
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                        std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x50));
                        iVar21 = iVar21 + 1;
                        unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    CONCAT71((int7)((ulong)lVar23 >> 8),1);
                      }
                      if (local_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410);
                      }
                    }
                    else {
                      poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x60));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x40));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x48));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x50));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                      std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x58));
                      iVar21 = iVar21 + 1;
                      unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  CONCAT71((int7)((ulong)lVar23 >> 8),1);
                    }
                    if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
                    }
                  }
                  else {
                    poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                    poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                    std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                    iVar21 = iVar21 + 1;
                    unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                CONCAT71((int7)((ulong)lVar23 >> 8),1);
                  }
                  if (local_4a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8);
                  }
                }
                else {
                  poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                  std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x40));
                  iVar21 = iVar21 + 1;
                  unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              CONCAT71((int7)((ulong)lVar23 >> 8),1);
                }
                if (local_470 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470);
                }
              }
              else {
                poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x40));
                iVar21 = iVar21 + 1;
                unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT71((int7)((ulong)lVar23 >> 8),1);
              }
              if (p_Var34 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var34);
              }
            }
            else {
              poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
              std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x30));
              iVar21 = iVar21 + 1;
              unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
            }
            if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
            }
            if ((char)unaff_R13 != '\0') {
              ChVisualMaterial::Default();
              fVar2 = *(float *)(local_438._0_8_ + 0xc);
              local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          CONCAT44(local_4a8._4_4_,*(undefined4 *)(local_438._0_8_ + 0x10));
              fVar3 = *(float *)(local_438._0_8_ + 0x14);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
              }
              p_Var30 = p_Var33->_vptr__Sp_counted_base[2];
              if (0 < (int)((ulong)((long)p_Var33->_vptr__Sp_counted_base[3] - (long)p_Var30) >> 4))
              {
                lVar23 = *(long *)p_Var30;
                p_Var27 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var30 + 8);
                if (p_Var27 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  fVar2 = *(float *)(lVar23 + 0xc);
                  local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              CONCAT44(local_4a8._4_4_,*(undefined4 *)(lVar23 + 0x10));
                  fVar3 = *(float *)(lVar23 + 0x14);
                }
                else {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
                  }
                  fVar2 = *(float *)(lVar23 + 0xc);
                  local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              CONCAT44(local_4a8._4_4_,*(undefined4 *)(lVar23 + 0x10));
                  fVar3 = *(float *)(lVar23 + 0x14);
                  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
                  }
                }
              }
              poVar22 = (ostream *)
                        std::ostream::operator<<
                                  (poVar1,(pCVar5->super_ChPhysicsItem).super_ChObj.m_identifier);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              (*(pCVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])(pCVar5);
              bVar19 = SUB81(poVar1,0);
              poVar22 = std::ostream::_M_insert<bool>(bVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)local_250._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)aStack_240._M_allocated_capacity);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)aStack_240._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(local_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(local_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(local_220);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(local_218);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)fVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)local_4a8._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)fVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              std::__cxx11::stringbuf::str();
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,(char *)local_438._0_8_,local_438._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + bVar19);
              std::ostream::put(bVar19);
              std::ostream::flush();
              if ((double *)local_438._0_8_ != local_428) {
                operator_delete((void *)local_438._0_8_,(long)local_428[0] + 1);
              }
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)&local_138);
          }
        }
      }
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
      }
      p_Var29 = p_Var28 + 1;
      local_468 = p_Var28;
    } while (p_Var28 + 1 != local_488);
  }
  psVar26 = (local_400->assembly).linklist.
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_410 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (local_400->assembly).linklist.
              super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  iVar20 = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar26 != local_410) {
    iVar20 = 0;
    do {
      peVar7 = (psVar26->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var29 = (psVar26->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
        }
      }
      if (peVar7 == (element_type *)0x0) {
        lVar23 = 0;
      }
      else {
        lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkLockRevolute::typeinfo,0);
      }
      p_Var28 = p_Var29;
      if (lVar23 == 0) {
        p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
          p_Var28 = p_Var29;
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          p_Var28 = p_Var29;
        }
      }
      if (lVar23 == 0) {
        if (peVar7 == (element_type *)0x0) {
          lVar23 = 0;
        }
        else {
          lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkLockSpherical::typeinfo,0);
        }
        local_4a8 = p_Var29;
        if (lVar23 == 0) {
          local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            UNLOCK();
            local_4a8 = p_Var29;
          }
          else {
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            local_4a8 = p_Var29;
          }
        }
        if (lVar23 == 0) {
          if (peVar7 == (element_type *)0x0) {
            lVar23 = 0;
          }
          else {
            lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkLockPrismatic::typeinfo,0);
          }
          local_490 = p_Var29;
          if (lVar23 == 0) {
            local_490 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
              UNLOCK();
              local_490 = p_Var29;
            }
            else {
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
              local_490 = p_Var29;
            }
          }
          if (lVar23 == 0) {
            if (peVar7 == (element_type *)0x0) {
              lVar23 = 0;
            }
            else {
              lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkLockCylindrical::typeinfo,
                                      0);
            }
            local_478 = p_Var29;
            if (lVar23 == 0) {
              local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                UNLOCK();
                local_478 = p_Var29;
              }
              else {
                p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                local_478 = p_Var29;
              }
            }
            if (lVar23 == 0) {
              if (peVar7 == (element_type *)0x0) {
                lVar23 = 0;
              }
              else {
                lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkUniversal::typeinfo,0);
              }
              p_Var33 = p_Var29;
              if (lVar23 == 0) {
                p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                  UNLOCK();
                  p_Var33 = p_Var29;
                }
                else {
                  p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                  p_Var33 = p_Var29;
                }
              }
              if (lVar23 == 0) {
                if (peVar7 == (element_type *)0x0) {
                  lVar23 = 0;
                }
                else {
                  lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkTSDA::typeinfo,0);
                }
                p_Var27 = p_Var29;
                if (lVar23 == 0) {
                  p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                    UNLOCK();
                    p_Var27 = p_Var29;
                  }
                  else {
                    p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                    p_Var27 = p_Var29;
                  }
                }
                if (lVar23 == 0) {
                  if (peVar7 == (element_type *)0x0) {
                    lVar23 = 0;
                  }
                  else {
                    lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkDistance::typeinfo,0
                                           );
                  }
                  local_488 = p_Var29;
                  if (lVar23 == 0) {
                    local_488 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  }
                  if (lVar23 != 0 && p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                  {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                      UNLOCK();
                      local_488 = p_Var29;
                    }
                    else {
                      p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                      local_488 = p_Var29;
                    }
                  }
                  if (lVar23 == 0) {
                    if (peVar7 == (element_type *)0x0) {
                      lVar23 = 0;
                    }
                    else {
                      lVar23 = __dynamic_cast(peVar7,&ChLinkBase::typeinfo,
                                              &ChLinkRevoluteSpherical::typeinfo,0);
                    }
                    p_Var34 = p_Var29;
                    if (lVar23 == 0) {
                      p_Var34 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    }
                    if (lVar23 != 0 &&
                        p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                        UNLOCK();
                        p_Var34 = p_Var29;
                      }
                      else {
                        p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                        p_Var34 = p_Var29;
                      }
                    }
                    if (lVar23 != 0) {
                      poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar23 + 0xb8),
                                 (ChVector<double> *)(*(long *)(lVar23 + 0x78) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar23 + 0x78) + 0x40));
                      poVar22 = std::ostream::_M_insert<double>((double)local_1b8._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      poVar22 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      poVar22 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar23 + 0xd0),
                                 (ChVector<double> *)(*(long *)(lVar23 + 0x80) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar23 + 0x80) + 0x40));
                      poVar22 = std::ostream::_M_insert<double>((double)local_250._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      poVar22 = std::ostream::_M_insert<double>((double)local_250._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      poVar22 = std::ostream::_M_insert<double>
                                          ((double)aStack_240._M_allocated_capacity);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                                 local_3f8.m_delim._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) +
                                      (char)&local_3f8.m_ss);
                      std::ostream::put((char)&local_3f8.m_ss);
                      std::ostream::flush();
                      iVar20 = iVar20 + 1;
                    }
                    if (p_Var34 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var34);
                    }
                  }
                  else {
                    poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    ChTransform<double>::TransformLocalToParent
                              ((ChVector<double> *)(lVar23 + 200),
                               (ChVector<double> *)(*(long *)(lVar23 + 0x78) + 8),
                               (ChMatrix33<double> *)(*(long *)(lVar23 + 0x78) + 0x40));
                    poVar22 = std::ostream::_M_insert<double>((double)local_1b8._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    poVar22 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    poVar22 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    ChTransform<double>::TransformLocalToParent
                              ((ChVector<double> *)(lVar23 + 0xe0),
                               (ChVector<double> *)(*(long *)(lVar23 + 0x80) + 8),
                               (ChMatrix33<double> *)(*(long *)(lVar23 + 0x80) + 0x40));
                    poVar22 = std::ostream::_M_insert<double>((double)local_250._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    poVar22 = std::ostream::_M_insert<double>((double)local_250._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    poVar22 = std::ostream::_M_insert<double>
                                        ((double)aStack_240._M_allocated_capacity);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                               local_3f8.m_delim._M_string_length);
                    cVar12 = (char)&local_3f8.m_ss;
                    std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
                    std::ostream::put(cVar12);
                    std::ostream::flush();
                    iVar20 = iVar20 + 1;
                  }
                  if (local_488 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488);
                  }
                }
                else {
                  poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0xe8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0xf0));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0xf8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x100));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x108));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  poVar22 = std::ostream::_M_insert<double>(*(double *)(lVar23 + 0x110));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                             local_3f8.m_delim._M_string_length);
                  cVar12 = (char)&local_3f8.m_ss;
                  std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
                  std::ostream::put(cVar12);
                  std::ostream::flush();
                  iVar20 = iVar20 + 1;
                }
                if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
                }
              }
              else {
                ChFrame<double>::operator>>
                          ((ChFrame<double> *)local_1b8,(ChFrame<double> *)(lVar23 + 0xb8),
                           *(ChFrame<double> **)(lVar23 + 0x78));
                ChFrame<double>::operator>>
                          ((ChFrame<double> *)local_250,(ChFrame<double> *)(lVar23 + 0x140),
                           *(ChFrame<double> **)(lVar23 + 0x80));
                poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)local_1b8._24_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                uVar15 = local_1b8._112_8_;
                uVar25 = local_1b8._88_8_;
                poVar22 = std::ostream::_M_insert<double>((double)local_1b8._64_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)uVar25);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)uVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                dVar14 = local_1d8;
                dVar13 = local_1f0;
                poVar22 = std::ostream::_M_insert<double>(local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>(dVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>(dVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                cVar12 = (char)&local_3f8.m_ss;
                std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
                std::ostream::put(cVar12);
                std::ostream::flush();
                iVar20 = iVar20 + 1;
              }
              if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
              }
            }
            else {
              pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x78);
              lVar9 = *(long *)(lVar23 + 0xb8);
              local_428[0] = 0.0;
              local_438 = ZEXT816(0);
              local_250._0_8_ = (_func_int **)0x3ff0000000000000;
              aStack_240._8_8_ = 0.0;
              stack0xfffffffffffffdb8 = ZEXT816(0);
              ChFrameMoving<double>::ChFrameMoving
                        ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                         (ChQuaternion<double> *)local_250);
              ChFrameMoving<double>::TransformLocalToParent
                        (pCVar8,(ChFrameMoving<double> *)(lVar9 + 0x38),
                         (ChFrameMoving<double> *)local_1b8);
              dVar13 = local_138;
              uVar18 = local_1b8._104_8_;
              uVar17 = local_1b8._80_8_;
              uVar16 = local_1b8._24_8_;
              uVar15 = local_1b8._16_8_;
              uVar25 = local_1b8._8_8_;
              pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x80);
              lVar23 = *(long *)(lVar23 + 0xc0);
              local_428[0] = 0.0;
              local_438 = ZEXT816(0) << 0x20;
              local_250._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x3ff0000000000000;
              aStack_240._8_8_ = 0.0;
              unique0x10003d4d = local_438;
              ChFrameMoving<double>::ChFrameMoving
                        ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                         (ChQuaternion<double> *)local_250);
              ChFrameMoving<double>::TransformLocalToParent
                        (pCVar8,(ChFrameMoving<double> *)(lVar23 + 0x38),
                         (ChFrameMoving<double> *)local_1b8);
              poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)uVar25);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)uVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)uVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)uVar17);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)uVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(dVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              cVar12 = (char)&local_3f8.m_ss;
              std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
              std::ostream::put(cVar12);
              std::ostream::flush();
              iVar20 = iVar20 + 1;
            }
            if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
            }
          }
          else {
            pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x78);
            lVar9 = *(long *)(lVar23 + 0xb8);
            local_428[0] = 0.0;
            local_438 = ZEXT816(0);
            local_250._0_8_ = (_func_int **)0x3ff0000000000000;
            aStack_240._8_8_ = 0.0;
            stack0xfffffffffffffdb8 = ZEXT816(0);
            ChFrameMoving<double>::ChFrameMoving
                      ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                       (ChQuaternion<double> *)local_250);
            ChFrameMoving<double>::TransformLocalToParent
                      (pCVar8,(ChFrameMoving<double> *)(lVar9 + 0x38),
                       (ChFrameMoving<double> *)local_1b8);
            dVar13 = local_138;
            uVar18 = local_1b8._104_8_;
            uVar17 = local_1b8._80_8_;
            uVar16 = local_1b8._24_8_;
            uVar15 = local_1b8._16_8_;
            uVar25 = local_1b8._8_8_;
            pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x80);
            lVar23 = *(long *)(lVar23 + 0xc0);
            local_428[0] = 0.0;
            local_438 = ZEXT816(0) << 0x20;
            local_250._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x3ff0000000000000;
            aStack_240._8_8_ = 0.0;
            unique0x10003d5d = local_438;
            ChFrameMoving<double>::ChFrameMoving
                      ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                       (ChQuaternion<double> *)local_250);
            ChFrameMoving<double>::TransformLocalToParent
                      (pCVar8,(ChFrameMoving<double> *)(lVar23 + 0x38),
                       (ChFrameMoving<double> *)local_1b8);
            poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>((double)uVar25);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>((double)uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>((double)uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>((double)uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>((double)uVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            poVar22 = std::ostream::_M_insert<double>(dVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length
                      );
            cVar12 = (char)&local_3f8.m_ss;
            std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
            std::ostream::put(cVar12);
            std::ostream::flush();
            iVar20 = iVar20 + 1;
          }
          if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
          }
        }
        else {
          pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x78);
          lVar9 = *(long *)(lVar23 + 0xb8);
          local_428[0] = 0.0;
          local_438 = ZEXT816(0);
          local_250._0_8_ = (_func_int **)0x3ff0000000000000;
          aStack_240._8_8_ = 0.0;
          stack0xfffffffffffffdb8 = ZEXT816(0);
          ChFrameMoving<double>::ChFrameMoving
                    ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                     (ChQuaternion<double> *)local_250);
          ChFrameMoving<double>::TransformLocalToParent
                    (pCVar8,(ChFrameMoving<double> *)(lVar9 + 0x38),
                     (ChFrameMoving<double> *)local_1b8);
          uVar16 = local_1b8._24_8_;
          uVar15 = local_1b8._16_8_;
          uVar25 = local_1b8._8_8_;
          pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x80);
          lVar23 = *(long *)(lVar23 + 0xc0);
          local_428[0] = 0.0;
          local_438 = ZEXT816(0) << 0x20;
          local_250._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3ff0000000000000;
          aStack_240._8_8_ = 0.0;
          unique0x10003d6d = local_438;
          ChFrameMoving<double>::ChFrameMoving
                    ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                     (ChQuaternion<double> *)local_250);
          ChFrameMoving<double>::TransformLocalToParent
                    (pCVar8,(ChFrameMoving<double> *)(lVar23 + 0x38),
                     (ChFrameMoving<double> *)local_1b8);
          poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>((double)uVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>((double)uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          poVar22 = std::ostream::_M_insert<double>((double)uVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
          cVar12 = (char)&local_3f8.m_ss;
          std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
          std::ostream::put(cVar12);
          std::ostream::flush();
          iVar20 = iVar20 + 1;
        }
        if (local_4a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8);
        }
      }
      else {
        pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x78);
        lVar9 = *(long *)(lVar23 + 0xb8);
        local_428[0] = 0.0;
        local_438 = ZEXT816(0);
        local_250._0_8_ = (_func_int **)0x3ff0000000000000;
        aStack_240._8_8_ = 0.0;
        stack0xfffffffffffffdb8 = ZEXT816(0);
        ChFrameMoving<double>::ChFrameMoving
                  ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                   (ChQuaternion<double> *)local_250);
        ChFrameMoving<double>::TransformLocalToParent
                  (pCVar8,(ChFrameMoving<double> *)(lVar9 + 0x38),(ChFrameMoving<double> *)local_1b8
                  );
        dVar13 = local_138;
        uVar18 = local_1b8._104_8_;
        uVar17 = local_1b8._80_8_;
        uVar16 = local_1b8._24_8_;
        uVar15 = local_1b8._16_8_;
        uVar25 = local_1b8._8_8_;
        pCVar8 = *(ChFrameMoving<double> **)(lVar23 + 0x80);
        lVar23 = *(long *)(lVar23 + 0xc0);
        local_428[0] = 0.0;
        local_438 = ZEXT816(0) << 0x20;
        local_250._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        aStack_240._8_8_ = 0.0;
        unique0x10003d7d = local_438;
        ChFrameMoving<double>::ChFrameMoving
                  ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                   (ChQuaternion<double> *)local_250);
        ChFrameMoving<double>::TransformLocalToParent
                  (pCVar8,(ChFrameMoving<double> *)(lVar23 + 0x38),
                   (ChFrameMoving<double> *)local_1b8);
        poVar22 = (ostream *)std::ostream::operator<<(&local_3f8.m_ss,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>((double)uVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>((double)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>((double)uVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>((double)uVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>((double)uVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        poVar22 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,local_3f8.m_delim._M_dataplus._M_p,local_3f8.m_delim._M_string_length);
        cVar12 = (char)&local_3f8.m_ss;
        std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
        std::ostream::put(cVar12);
        std::ostream::flush();
        iVar20 = iVar20 + 1;
      }
      if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
      }
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
      }
      psVar26 = psVar26 + 1;
    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar26 != local_410);
  }
  iVar31 = 0;
  psVar26 = (local_400->assembly).linklist.
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar10 = (local_400->assembly).linklist.
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar26 != psVar10) {
    poVar1 = &local_3f8.m_ss;
    iVar31 = 0;
    do {
      peVar7 = (psVar26->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var29 = (psVar26->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
        }
      }
      if (peVar7 == (element_type *)0x0) {
        this = (ChPhysicsItem *)0x0;
      }
      else {
        this = (ChPhysicsItem *)__dynamic_cast(peVar7,&ChLinkBase::typeinfo,&ChLinkTSDA::typeinfo,0)
        ;
      }
      local_4a8 = p_Var29;
      if (this == (ChPhysicsItem *)0x0) {
        local_4a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (this != (ChPhysicsItem *)0x0 &&
          p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
          local_4a8 = p_Var29;
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          local_4a8 = p_Var29;
        }
      }
      if (this != (ChPhysicsItem *)0x0) {
        ChPhysicsItem::GetVisualModel(this);
        uVar25 = local_1b8._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if ((_func_int **)uVar25 != (_func_int **)0x0) {
          ChPhysicsItem::GetVisualModel(this);
          uVar25 = local_1b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          p_Var11 = *(_func_int **)(uVar25 + 8);
          for (p_Var30 = *(_func_int **)uVar25; p_Var30 != p_Var11; p_Var30 = p_Var30 + 0x98) {
            if (*(long *)p_Var30 == 0) {
              bVar19 = true;
            }
            else {
              lVar23 = __dynamic_cast(*(long *)p_Var30,&ChVisualShape::typeinfo,
                                      &ChSegmentShape::typeinfo,0);
              bVar19 = lVar23 == 0;
            }
            if (bVar19) {
              p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              p_Var28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var30 + 8);
              if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
                }
              }
            }
            if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
            }
            cVar12 = (char)poVar1;
            if (bVar19) {
              if (*(long *)p_Var30 == 0) {
                bVar19 = true;
              }
              else {
                lVar23 = __dynamic_cast(*(long *)p_Var30,&ChVisualShape::typeinfo,
                                        &ChSpringShape::typeinfo,0);
                bVar19 = lVar23 == 0;
              }
              if (bVar19) {
                p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                p_Var28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var30 + 8);
                if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var28->_M_use_count = p_Var28->_M_use_count + 1;
                  }
                }
              }
              if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
              }
              if (!bVar19) {
                poVar22 = (ostream *)std::ostream::operator<<(poVar1,1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>(*(double *)&this[1].offset_L);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>((double)this[2].super_ChObj._vptr_ChObj);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>
                                    ((double)this[2].super_ChObj.m_name._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>
                                    ((double)this[2].super_ChObj.m_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>
                                    ((double)this[2].super_ChObj.m_name.field_2.
                                             _M_allocated_capacity);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                poVar22 = std::ostream::_M_insert<double>
                                    (*(double *)((long)&this[2].super_ChObj.m_name.field_2 + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                           local_3f8.m_delim._M_string_length);
                std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
                std::ostream::put(cVar12);
                std::ostream::flush();
                goto LAB_0094b6fa;
              }
            }
            else {
              poVar22 = (ostream *)std::ostream::operator<<(poVar1,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>(*(double *)&this[1].offset_L);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>((double)this[2].super_ChObj._vptr_ChObj);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>
                                  ((double)this[2].super_ChObj.m_name._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>
                                  ((double)this[2].super_ChObj.m_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>
                                  ((double)this[2].super_ChObj.m_name.field_2._M_allocated_capacity)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              poVar22 = std::ostream::_M_insert<double>
                                  (*(double *)((long)&this[2].super_ChObj.m_name.field_2 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,local_3f8.m_delim._M_dataplus._M_p,
                         local_3f8.m_delim._M_string_length);
              std::ios::widen((char)*(undefined8 *)(local_3f8._32_8_ + -0x18) + cVar12);
              std::ostream::put(cVar12);
              std::ostream::flush();
LAB_0094b6fa:
              iVar31 = iVar31 + 1;
            }
          }
        }
      }
      if (local_4a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8);
      }
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
      }
      psVar26 = psVar26 + 1;
    } while (psVar26 != psVar10);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar22 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,local_43c);
  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar21);
  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar20);
  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar31);
  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar22,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
  std::ostream::put((char)poVar22);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  CSV_writer::write_to_file(&local_3f8,local_1c0,(string *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._0_8_ != &aStack_240) {
    operator_delete((void *)local_250._0_8_,aStack_240._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  CSV_writer::~CSV_writer(&local_3f8);
  return;
}

Assistant:

void WriteVisualizationAssets(ChSystem* system,
                              const std::string& filename,
                              std::function<bool(const ChBody&)> selector,
                              bool body_info,
                              const std::string& delim) {
    CSV_writer csv(delim);

    // If requested, Loop over all bodies and write out their position and
    // orientation.  Otherwise, body count is left at 0.
    int b_count = 0;

    if (body_info) {
        for (auto body : system->Get_bodylist()) {
            if (!selector(*body))
                continue;

            const ChVector<>& body_pos = body->GetFrame_REF_to_abs().GetPos();
            const ChQuaternion<>& body_rot = body->GetFrame_REF_to_abs().GetRot();

            csv << body->GetIdentifier() << body->IsActive() << body_pos << body_rot << std::endl;

            b_count++;
        }
    }

    // Loop over all bodies and over all their assets.
    int a_count = 0;
    for (auto body : system->Get_bodylist()) {
        if (!selector(*body))
            continue;

        if (!body->GetVisualModel())
            continue;

        // Loop over visual shapes -- write information for supported types.
        for (auto& shape_instance : body->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            auto X_GS = body->GetFrame_REF_to_abs() * shape_instance.second;
            auto& pos = X_GS.GetPos();
            auto& rot = X_GS.GetRot();

            bool supported = true;
            std::stringstream gss;

            if (auto sphere = std::dynamic_pointer_cast<ChSphereShape>(shape)) {
                gss << SPHERE << delim << sphere->GetSphereGeometry().rad;
                a_count++;
            } else if (auto ellipsoid = std::dynamic_pointer_cast<ChEllipsoidShape>(shape)) {
                const Vector& size = ellipsoid->GetEllipsoidGeometry().rad;
                gss << ELLIPSOID << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto box = std::dynamic_pointer_cast<ChBoxShape>(shape)) {
                const Vector& size = box->GetBoxGeometry().Size;
                gss << BOX << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto capsule = std::dynamic_pointer_cast<ChCapsuleShape>(shape)) {
                const geometry::ChCapsule& geom = capsule->GetCapsuleGeometry();
                gss << CAPSULE << delim << geom.rad << delim << geom.hlen;
                a_count++;
            } else if (auto cylinder = std::dynamic_pointer_cast<ChCylinderShape>(shape)) {
                const geometry::ChCylinder& geom = cylinder->GetCylinderGeometry();
                gss << CYLINDER << delim << geom.rad << delim << geom.p1.x() << delim << geom.p1.y() << delim
                    << geom.p1.z() << delim << geom.p2.x() << delim << geom.p2.y() << delim << geom.p2.z();
                a_count++;
            } else if (auto cone = std::dynamic_pointer_cast<ChConeShape>(shape)) {
                const geometry::ChCone& geom = cone->GetConeGeometry();
                gss << CONE << delim << geom.rad.x() << delim << geom.rad.y();
                a_count++;
            } else if (auto rbox = std::dynamic_pointer_cast<ChRoundedBoxShape>(shape)) {
                const geometry::ChRoundedBox& geom = rbox->GetRoundedBoxGeometry();
                gss << ROUNDEDBOX << delim << geom.Size.x() << delim << geom.Size.y() << delim << geom.Size.z() << delim
                    << geom.radsphere;
                a_count++;
            } else if (auto rcyl = std::dynamic_pointer_cast<ChRoundedCylinderShape>(shape)) {
                const geometry::ChRoundedCylinder& geom = rcyl->GetRoundedCylinderGeometry();
                gss << ROUNDEDCYL << delim << geom.rad << delim << geom.hlen << delim << geom.radsphere;
                a_count++;
            } else if (auto mesh = std::dynamic_pointer_cast<ChTriangleMeshShape>(shape)) {
                gss << TRIANGLEMESH << delim << "\"" << mesh->GetName() << "\"";
                a_count++;
            } else if (auto line = std::dynamic_pointer_cast<ChLineShape>(shape)) {
                std::shared_ptr<geometry::ChLine> geom = line->GetLineGeometry();
                if (auto bezier = std::dynamic_pointer_cast<geometry::ChLineBezier>(geom)) {
                    gss << BEZIER << delim << "\"" << line->GetName() << "\"";
                    a_count++;
                } else {
                    supported = false;
                }
            } else {
                supported = false;
            }

            if (supported) {
                ChColor col = ChVisualMaterial::Default()->GetDiffuseColor();
                if (shape->GetNumMaterials() > 0)
                    col = shape->GetMaterial(0)->GetDiffuseColor();
                csv << body->GetIdentifier() << body->IsActive() << pos << rot << col << gss.str() << std::endl;
            }
        }
    }

    // Loop over all links.  Write information on selected types of links.
    int l_count = 0;
    for (auto ilink : system->Get_linklist()) {
        if (auto linkR = std::dynamic_pointer_cast<ChLinkLockRevolute>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkR->GetMarker1()) >> *(linkR->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkR->GetMarker2()) >> *(linkR->GetBody2());

            csv << REVOLUTE << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkS = std::dynamic_pointer_cast<ChLinkLockSpherical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkS->GetMarker1()) >> *(linkS->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkS->GetMarker2()) >> *(linkS->GetBody2());

            csv << SPHERICAL << frA_abs.GetPos() << std::endl;
            l_count++;
        } else if (auto linkP = std::dynamic_pointer_cast<ChLinkLockPrismatic>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkP->GetMarker1()) >> *(linkP->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkP->GetMarker2()) >> *(linkP->GetBody2());

            csv << PRISMATIC << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkC = std::dynamic_pointer_cast<ChLinkLockCylindrical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkC->GetMarker1()) >> *(linkC->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkC->GetMarker2()) >> *(linkC->GetBody2());

            csv << CYLINDRICAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkU = std::dynamic_pointer_cast<ChLinkUniversal>(ilink)) {
            chrono::ChFrame<> frA_abs = linkU->GetFrame1Abs();
            chrono::ChFrame<> frB_abs = linkU->GetFrame2Abs();

            csv << UNIVERSAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Xaxis() << frB_abs.GetA().Get_A_Yaxis()
                << std::endl;
            l_count++;
        } else if (auto linkT = std::dynamic_pointer_cast<ChLinkTSDA>(ilink)) {
            csv << TSDA << linkT->GetPoint1Abs() << linkT->GetPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkD = std::dynamic_pointer_cast<ChLinkDistance>(ilink)) {
            csv << DISTANCE << linkD->GetEndPoint1Abs() << linkD->GetEndPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkRS = std::dynamic_pointer_cast<ChLinkRevoluteSpherical>(ilink)) {
            csv << REV_SPH << linkRS->GetPoint1Abs() << linkRS->GetPoint2Abs() << std::endl;
            l_count++;
        }
    }

    // Loop over links and write assets associated with spring-dampers.
    int la_count = 0;
    for (auto ilink : system->Get_linklist()) {
        auto link = std::dynamic_pointer_cast<ChLinkTSDA>(ilink);
        if (!link)
            continue;
        if (!link->GetVisualModel())
            continue;
        for (auto& shape_instance : link->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            if (std::dynamic_pointer_cast<ChSegmentShape>(shape)) {
                csv << SEGMENT << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            } else if (std::dynamic_pointer_cast<ChSpringShape>(shape)) {
                csv << COIL << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            }
        }
    }

    // Write the output file, including a first line with number of bodies, visual
    // assets, links, and TSDA assets.
    std::stringstream header;
    header << b_count << delim << a_count << delim << l_count << delim << la_count << delim << std::endl;

    csv.write_to_file(filename, header.str());
}